

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::Maybe<capnp::MessageReaderAndFds>::Maybe
          (Maybe<capnp::MessageReaderAndFds> *this,Maybe<capnp::MessageReaderAndFds> *other)

{
  kj::_::NullableValue<capnp::MessageReaderAndFds>::NullableValue(&this->ptr,&other->ptr);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }